

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

DistributionMapping __thiscall
amrex::DistributionMapping::makeSFC(DistributionMapping *this,MultiFab *weight,Real *eff,bool sort)

{
  int nprocs;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  DistributionMapping DVar4;
  Vector<long,_std::allocator<long>_> cost;
  allocator_type local_51;
  vector<long,_std::allocator<long>_> local_50;
  value_type_conflict3 local_38;
  
  peVar1 = (weight->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = 1;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_50,
             (long)((int)((ulong)((long)*(pointer *)
                                         ((long)&(peVar1->m_abox).
                                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                 .
                                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&(peVar1->m_abox).
                                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                           ._M_impl.super__Vector_impl_data) >> 2) * -0x49249249),
             &local_38,&local_51);
  nprocs = *(int *)(DAT_00816950 + -0x38);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0080c860;
  p_Var2[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[5]._M_use_count = 0;
  p_Var2[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[2]._M_use_count = 0;
  p_Var2[2]._M_weak_count = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[3]._M_weak_count = 0;
  *(undefined8 *)&p_Var2[3]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var2[4]._vptr__Sp_counted_base + 4) = 0;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (this->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var2 + 1);
  SFCProcessorMap(this,&(weight->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                  &local_50,nprocs,eff,sort);
  _Var3._M_pi = extraout_RDX;
  if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var3._M_pi = extraout_RDX_00;
  }
  DVar4.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  DVar4.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (DistributionMapping)
         DVar4.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const MultiFab& weight, Real& eff, bool sort)
{
    BL_PROFILE("makeSFC");
    Vector<Long> cost = gather_weights(weight);
    int nprocs = ParallelContext::NProcsSub();
    DistributionMapping r;
    r.SFCProcessorMap(weight.boxArray(), cost, nprocs, eff, sort);
    return r;
}